

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O1

void Fxu_UpdateMatrixSingleClean(Fxu_Matrix *p,Fxu_Var *pVar1,Fxu_Var *pVar2,Fxu_Var *pVarNew)

{
  int iVar1;
  int iVar2;
  Fxu_Cube *pFVar3;
  int iVar4;
  Fxu_Lit *pFVar5;
  Fxu_Lit *pFVar6;
  Fxu_Lit *pFVar7;
  Fxu_Lit *pFVar8;
  Fxu_Lit *pLit;
  Fxu_Lit *pLit_00;
  bool bVar9;
  
  pLit_00 = (pVar1->lLits).pHead;
  pLit = (pVar2->lLits).pHead;
  if (pLit_00 == (Fxu_Lit *)0x0) {
    pFVar7 = (Fxu_Lit *)0x0;
  }
  else {
    pFVar7 = pLit_00->pVNext;
  }
  if (pLit == (Fxu_Lit *)0x0) {
    pFVar5 = (Fxu_Lit *)0x0;
  }
  else {
    pFVar5 = pLit->pVNext;
  }
  do {
    while( true ) {
      while ((pFVar8 = pFVar5, pFVar6 = pFVar7, pFVar7 = pFVar6, pFVar5 = pFVar8,
             pLit_00 == (Fxu_Lit *)0x0 || (pLit == (Fxu_Lit *)0x0))) {
        if ((pLit_00 == (Fxu_Lit *)0x0) || (pLit != (Fxu_Lit *)0x0)) {
          if ((pLit_00 != (Fxu_Lit *)0x0) || (pLit == (Fxu_Lit *)0x0)) {
            return;
          }
          pLit_00 = (Fxu_Lit *)0x0;
          pFVar5 = (Fxu_Lit *)0x0;
          pLit = pFVar8;
          if (pFVar8 != (Fxu_Lit *)0x0) {
            pLit_00 = (Fxu_Lit *)0x0;
            pFVar5 = pFVar8->pVNext;
          }
        }
        else {
          pFVar7 = (Fxu_Lit *)0x0;
          pLit = (Fxu_Lit *)0x0;
          pLit_00 = pFVar6;
          if (pFVar6 != (Fxu_Lit *)0x0) {
            pFVar7 = pFVar6->pVNext;
            pLit = (Fxu_Lit *)0x0;
          }
        }
      }
      pFVar3 = pLit_00->pCube;
      iVar1 = pLit->pCube->pVar->iVar;
      iVar2 = pFVar3->pVar->iVar;
      bVar9 = SBORROW4(iVar2,iVar1);
      iVar4 = iVar2 - iVar1;
      if (iVar2 == iVar1) break;
LAB_0044022b:
      if (bVar9 == iVar4 < 0) {
        pFVar5 = (Fxu_Lit *)0x0;
        pLit = pFVar8;
        if (pFVar8 != (Fxu_Lit *)0x0) {
          pFVar5 = pFVar8->pVNext;
        }
      }
      else {
        pFVar7 = (Fxu_Lit *)0x0;
        pLit_00 = pFVar6;
        if (pFVar6 != (Fxu_Lit *)0x0) {
          pFVar7 = pFVar6->pVNext;
        }
      }
    }
    iVar1 = pLit->iCube;
    iVar2 = pLit_00->iCube;
    bVar9 = SBORROW4(iVar2,iVar1);
    iVar4 = iVar2 - iVar1;
    if (iVar2 != iVar1) goto LAB_0044022b;
    if (pFVar3->pOrder != (Fxu_Cube *)0x0) {
      __assert_fail("pLit1->pCube->pOrder == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                    ,0x202,
                    "void Fxu_UpdateMatrixSingleClean(Fxu_Matrix *, Fxu_Var *, Fxu_Var *, Fxu_Var *)"
                   );
    }
    *p->ppTailCubes = pFVar3;
    pFVar3 = pLit_00->pCube;
    p->ppTailCubes = &pFVar3->pOrder;
    pFVar3->pOrder = (Fxu_Cube *)0x1;
    Fxu_MatrixAddLiteral(p,pFVar3,pVarNew);
    Fxu_UpdateCleanOldDoubles(p,(Fxu_Double *)0x0,pLit_00->pCube);
    Fxu_MatrixDelLiteral(p,pLit_00);
    Fxu_MatrixDelLiteral(p,pLit);
    pFVar7 = (Fxu_Lit *)0x0;
    if (pFVar6 != (Fxu_Lit *)0x0) {
      pFVar7 = pFVar6->pVNext;
    }
    pFVar5 = (Fxu_Lit *)0x0;
    pLit = pFVar8;
    pLit_00 = pFVar6;
    if (pFVar8 != (Fxu_Lit *)0x0) {
      pFVar5 = pFVar8->pVNext;
    }
  } while( true );
}

Assistant:

void Fxu_UpdateMatrixSingleClean( Fxu_Matrix * p, Fxu_Var * pVar1, Fxu_Var * pVar2, Fxu_Var * pVarNew )
{
	Fxu_Lit * pLit1, * bLit1Next;
	Fxu_Lit * pLit2, * bLit2Next;

    // initialize the starting literals
	pLit1     = pVar1->lLits.pHead;
	pLit2     = pVar2->lLits.pHead;
	bLit1Next = pLit1? pLit1->pVNext: NULL;
	bLit2Next = pLit2? pLit2->pVNext: NULL;
	while ( 1 )
	{
		if ( pLit1 && pLit2 )
		{
    		if ( pLit1->pCube->pVar->iVar == pLit2->pCube->pVar->iVar )
			{ // these literals coincide 
			    if ( pLit1->iCube == pLit2->iCube )
			    { // these literals coincide 
                
                    // collect the affected cube
                    assert( pLit1->pCube->pOrder == NULL );
                    Fxu_MatrixRingCubesAdd( p, pLit1->pCube );

                    // add the literal to this cube corresponding to the new column
		            Fxu_MatrixAddLiteral( p, pLit1->pCube, pVarNew );
                    // clean the old cubes
		            Fxu_UpdateCleanOldDoubles( p, NULL, pLit1->pCube );

				    // remove the literals 
				    Fxu_MatrixDelLiteral( p, pLit1 );
				    Fxu_MatrixDelLiteral( p, pLit2 );

				    // go to the next literals
				    pLit1     = bLit1Next;
				    pLit2     = bLit2Next;
				    bLit1Next = pLit1? pLit1->pVNext: NULL;
				    bLit2Next = pLit2? pLit2->pVNext: NULL;
			    }
			    else if ( pLit1->iCube < pLit2->iCube )
			    {
				    pLit1     = bLit1Next;
				    bLit1Next = pLit1? pLit1->pVNext: NULL;
			    }
			    else
			    {
				    pLit2     = bLit2Next;
				    bLit2Next = pLit2? pLit2->pVNext: NULL;
			    }
            }
			else if ( pLit1->pCube->pVar->iVar < pLit2->pCube->pVar->iVar )
			{
				pLit1     = bLit1Next;
				bLit1Next = pLit1? pLit1->pVNext: NULL;
			}
			else
			{
				pLit2     = bLit2Next;
				bLit2Next = pLit2? pLit2->pVNext: NULL;
			}
		}
		else if ( pLit1 && !pLit2 )
		{
			pLit1     = bLit1Next;
			bLit1Next = pLit1? pLit1->pVNext: NULL;
		}
		else if ( !pLit1 && pLit2 )
		{
			pLit2     = bLit2Next;
			bLit2Next = pLit2? pLit2->pVNext: NULL;
		}
		else
			break;
	}
}